

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

uint8 * google::protobuf::internal::PrimitiveTypeHelper<18>::SerializeToArray
                  (void *ptr,uint8 *buffer)

{
  long *plVar1;
  uint64 value;
  uint8 *puVar2;
  uint8 *in_RSI;
  void *in_RDI;
  
  plVar1 = Get<long>(in_RDI);
  value = WireFormatLite::ZigZagEncode64(*plVar1);
  puVar2 = io::CodedOutputStream::WriteVarint64ToArray(value,in_RSI);
  return puVar2;
}

Assistant:

static uint8* SerializeToArray(const void* ptr, uint8* buffer) {
    return WireFormatLite::WriteSInt64NoTagToArray(Get<Type>(ptr), buffer);
  }